

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

void poly1305_process(mbedtls_poly1305_context *ctx,size_t nblocks,uchar *input,
                     uint32_t needs_padding)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar9 = (ulong)ctx->acc[0];
  uVar18 = (ulong)ctx->acc[1];
  uVar16 = (ulong)ctx->acc[2];
  uVar10 = (ulong)ctx->acc[3];
  uVar4 = ctx->acc[4];
  if (nblocks != 0) {
    uVar5 = (ulong)ctx->r[0];
    uVar1 = ctx->r[3];
    uVar11 = (ulong)((uVar1 >> 2) + uVar1);
    uVar3 = ctx->r[1];
    uVar12 = (ulong)uVar3;
    uVar2 = ctx->r[2];
    uVar6 = (ulong)((uVar2 >> 2) + uVar2);
    uVar7 = (ulong)((uVar3 >> 2) + uVar3);
    puVar8 = input + 0xf;
    do {
      uVar9 = (uVar9 & 0xffffffff) + (ulong)*(uint *)(puVar8 + -0xf);
      uVar17 = uVar9 & 0xffffffff;
      uVar9 = (uVar9 >> 0x20) + (uVar18 & 0xffffffff) + (ulong)*(uint *)(puVar8 + -0xb);
      uVar15 = uVar9 & 0xffffffff;
      uVar9 = (uVar9 >> 0x20) + (uVar16 & 0xffffffff) + (ulong)*(uint *)(puVar8 + -7);
      uVar16 = uVar9 & 0xffffffff;
      uVar9 = (uVar9 >> 0x20) + (uVar10 & 0xffffffff) + (ulong)*(uint *)(puVar8 + -3);
      uVar18 = uVar9 & 0xffffffff;
      uVar3 = uVar4 + needs_padding + (int)(uVar9 >> 0x20);
      uVar9 = (ulong)uVar3;
      uVar10 = uVar18 * uVar7 + uVar16 * uVar6 + uVar15 * uVar11 + uVar17 * uVar5;
      uVar13 = (uVar10 >> 0x20) +
               uVar9 * uVar7 + uVar18 * uVar6 + uVar16 * uVar11 + uVar15 * uVar5 + uVar17 * uVar12;
      uVar14 = (uVar13 >> 0x20) +
               uVar9 * uVar6 + uVar18 * uVar11 + uVar16 * uVar5 + uVar15 * uVar12 + uVar17 * uVar2;
      uVar15 = (uVar14 >> 0x20) +
               uVar9 * uVar11 + uVar18 * uVar5 + uVar16 * uVar12 + uVar15 * uVar2 + uVar17 * uVar1;
      uVar3 = (int)(uVar15 >> 0x20) + uVar3 * ctx->r[0];
      uVar9 = (ulong)(uVar3 & 0xfffffffc) + (ulong)(uVar3 >> 2) + (uVar10 & 0xffffffff);
      uVar18 = (uVar9 >> 0x20) + (uVar13 & 0xffffffff);
      uVar16 = (uVar18 >> 0x20) + (uVar14 & 0xffffffff);
      uVar10 = (uVar16 >> 0x20) + (uVar15 & 0xffffffff);
      uVar4 = (int)(uVar10 >> 0x20) + (uVar3 & 3);
      puVar8 = puVar8 + 0x10;
      nblocks = nblocks - 1;
    } while (nblocks != 0);
  }
  ctx->acc[0] = (uint32_t)uVar9;
  ctx->acc[1] = (uint32_t)uVar18;
  ctx->acc[2] = (uint32_t)uVar16;
  ctx->acc[3] = (uint32_t)uVar10;
  ctx->acc[4] = uVar4;
  return;
}

Assistant:

static void poly1305_process( mbedtls_poly1305_context *ctx,
                              size_t nblocks,
                              const unsigned char *input,
                              uint32_t needs_padding )
{
    uint64_t d0, d1, d2, d3;
    uint32_t acc0, acc1, acc2, acc3, acc4;
    uint32_t r0, r1, r2, r3;
    uint32_t rs1, rs2, rs3;
    size_t offset  = 0U;
    size_t i;

    r0 = ctx->r[0];
    r1 = ctx->r[1];
    r2 = ctx->r[2];
    r3 = ctx->r[3];

    rs1 = r1 + ( r1 >> 2U );
    rs2 = r2 + ( r2 >> 2U );
    rs3 = r3 + ( r3 >> 2U );

    acc0 = ctx->acc[0];
    acc1 = ctx->acc[1];
    acc2 = ctx->acc[2];
    acc3 = ctx->acc[3];
    acc4 = ctx->acc[4];

    /* Process full blocks */
    for( i = 0U; i < nblocks; i++ )
    {
        /* The input block is treated as a 128-bit little-endian integer */
        d0   = BYTES_TO_U32_LE( input, offset + 0  );
        d1   = BYTES_TO_U32_LE( input, offset + 4  );
        d2   = BYTES_TO_U32_LE( input, offset + 8  );
        d3   = BYTES_TO_U32_LE( input, offset + 12 );

        /* Compute: acc += (padded) block as a 130-bit integer */
        d0  += (uint64_t) acc0;
        d1  += (uint64_t) acc1 + ( d0 >> 32U );
        d2  += (uint64_t) acc2 + ( d1 >> 32U );
        d3  += (uint64_t) acc3 + ( d2 >> 32U );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 += (uint32_t) ( d3 >> 32U ) + needs_padding;

        /* Compute: acc *= r */
        d0 = mul64( acc0, r0  ) +
             mul64( acc1, rs3 ) +
             mul64( acc2, rs2 ) +
             mul64( acc3, rs1 );
        d1 = mul64( acc0, r1  ) +
             mul64( acc1, r0  ) +
             mul64( acc2, rs3 ) +
             mul64( acc3, rs2 ) +
             mul64( acc4, rs1 );
        d2 = mul64( acc0, r2  ) +
             mul64( acc1, r1  ) +
             mul64( acc2, r0  ) +
             mul64( acc3, rs3 ) +
             mul64( acc4, rs2 );
        d3 = mul64( acc0, r3  ) +
             mul64( acc1, r2  ) +
             mul64( acc2, r1  ) +
             mul64( acc3, r0  ) +
             mul64( acc4, rs3 );
        acc4 *= r0;

        /* Compute: acc %= (2^130 - 5) (partial remainder) */
        d1 += ( d0 >> 32 );
        d2 += ( d1 >> 32 );
        d3 += ( d2 >> 32 );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 = (uint32_t) ( d3 >> 32 ) + acc4;

        d0 = (uint64_t) acc0 + ( acc4 >> 2 ) + ( acc4 & 0xFFFFFFFCU );
        acc4 &= 3U;
        acc0 = (uint32_t) d0;
        d0 = (uint64_t) acc1 + ( d0 >> 32U );
        acc1 = (uint32_t) d0;
        d0 = (uint64_t) acc2 + ( d0 >> 32U );
        acc2 = (uint32_t) d0;
        d0 = (uint64_t) acc3 + ( d0 >> 32U );
        acc3 = (uint32_t) d0;
        d0 = (uint64_t) acc4 + ( d0 >> 32U );
        acc4 = (uint32_t) d0;

        offset    += POLY1305_BLOCK_SIZE_BYTES;
    }

    ctx->acc[0] = acc0;
    ctx->acc[1] = acc1;
    ctx->acc[2] = acc2;
    ctx->acc[3] = acc3;
    ctx->acc[4] = acc4;
}